

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lexer.cpp
# Opt level: O2

void __thiscall ninx::lexer::Lexer::Lexer(Lexer *this,istream *stream)

{
  allocator local_39;
  string local_38;
  
  std::__cxx11::string::string((string *)&local_38,"unknown_origin",&local_39);
  Lexer(this,stream,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  return;
}

Assistant:

ninx::lexer::Lexer::Lexer(std::istream &stream) : Lexer(stream, "unknown_origin") {}